

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O1

ulong __thiscall CTcDataStream::reserve(CTcDataStream *this,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = this->ofs_;
  if (this->rem_ < len) {
    do {
      if (this->rem_ == 0) {
        alloc_page(this);
      }
      uVar2 = this->rem_;
      uVar3 = uVar2;
      if (len < uVar2) {
        uVar3 = len;
      }
      this->ofs_ = this->ofs_ + uVar3;
      this->wp_ = this->wp_ + uVar3;
      this->rem_ = uVar2 - uVar3;
      len = len - uVar3;
    } while (len != 0);
  }
  else {
    this->ofs_ = uVar1 + len;
    this->wp_ = this->wp_ + len;
    this->rem_ = this->rem_ - len;
  }
  return uVar1;
}

Assistant:

ulong CTcDataStream::reserve(size_t len)
{
    ulong ret;

    /* we'll always return the offset current before the call */
    ret = ofs_;
    
    /* if we have space on the current page, it's easy */
    if (len <= rem_)
    {
        /* advance the output pointers */
        ofs_ += len;
        wp_ += len;
        rem_ -= len;
    }
    else
    {
        /* keep going until we satisfy the request */
        do
        {
            size_t cur;

            /* if necessary, allocate more memory */
            if (rem_ == 0)
                alloc_page();

            /* limit this chunk to the space remaining on the current page */
            cur = len;
            if (cur > rem_)
                cur = rem_;

            /* skip past this chunk */
            ofs_ += cur;
            wp_ += cur;
            rem_ -= cur;
            len -= cur;

        } while (len != 0);
    }

    /* return the starting offset */
    return ret;
}